

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<solitaire::interfaces::Button_&()>::ExplainMatchResultTo
          (TypedExpectation<solitaire::interfaces::Button_&()> *this,ArgumentTuple *args,ostream *os
          )

{
  Matcher<const_std::tuple<>_&> *this_00;
  bool bVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  int iVar4;
  ExpectationSet unsatisfied_prereqs;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  undefined1 local_1c8 [8];
  ostream *local_1c0;
  _Base_ptr local_1b8;
  _Rb_tree_node_base *local_1b0;
  _Rb_tree_node_base *local_1a8;
  size_t local_1a0;
  ios_base local_138 [264];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if ((this->super_ExpectationBase).retired_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"         Expected: the expectation is active\n",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(os,"           Actual: it is retired\n",0x21)
    ;
    return;
  }
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  this_00 = &this->extra_matcher_;
  local_1c0 = (ostream *)0x0;
  local_1c8 = (undefined1  [8])&PTR__MatchResultListener_003183f8;
  bVar1 = MatcherBase<const_std::tuple<>_&>::MatchAndExplain
                    (&this_00->super_MatcherBase<const_std::tuple<>_&>,args,
                     (MatchResultListener *)local_1c8);
  if (bVar1) {
    bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied(&this->super_ExpectationBase);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"The call matches the expectation.\n",0x22);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"         Expected: all pre-requisites are satisfied\n",0x34);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"           Actual: the following immediate pre-requisites ",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>(os,"are not satisfied:\n",0x13);
      local_1c0 = (ostream *)((ulong)local_1c0 & 0xffffffff00000000);
      local_1b8 = (_Base_ptr)0x0;
      local_1a0 = 0;
      local_1b0 = (_Rb_tree_node_base *)&local_1c0;
      local_1a8 = (_Rb_tree_node_base *)&local_1c0;
      ExpectationBase::FindUnsatisfiedPrerequisites
                (&this->super_ExpectationBase,(ExpectationSet *)local_1c8);
      if (local_1b0 != (_Rb_tree_node_base *)&local_1c0) {
        iVar4 = 0;
        p_Var3 = local_1b0;
        do {
          ExpectationBase::DescribeLocationTo(*(ExpectationBase **)(p_Var3 + 1),os);
          std::__ostream_insert<char,std::char_traits<char>>(os,"pre-requisite #",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
          iVar4 = iVar4 + 1;
        } while (p_Var3 != (_Rb_tree_node_base *)&local_1c0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"                   (end of pre-requisites)\n",0x2b);
      std::
      _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
      ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
                   *)local_1c8);
    }
  }
  else {
    local_1c0 = (ostream *)&local_1a8;
    local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_00318490;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    bVar1 = MatcherBase<const_std::tuple<>_&>::MatchAndExplain
                      (&this_00->super_MatcherBase<const_std::tuple<>_&>,args,
                       (MatchResultListener *)local_1c8);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"    Expected args: ",0x13);
      MatcherBase<const_std::tuple<>_&>::DescribeTo
                (&this_00->super_MatcherBase<const_std::tuple<>_&>,os);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"\n           Actual: don\'t match",0x1f);
      std::__cxx11::stringbuf::str();
      iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
      if (iVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1e8,local_1e0);
      }
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    }
    local_1c8 = (undefined1  [8])&PTR__StringMatchResultListener_00318490;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }